

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgrayraster.c
# Opt level: O2

void gray_render_cubic(PWorker worker,QT_FT_Vector *control1,QT_FT_Vector *control2,QT_FT_Vector *to
                      )

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int *piVar15;
  int *piVar16;
  ulong uVar17;
  long lVar18;
  long in_FS_OFFSET;
  int iVar19;
  int iVar20;
  int local_1c8;
  int iStack_1c4;
  int local_1c0;
  int iStack_1bc;
  int iStack_1b8;
  int iStack_1b4;
  int local_1b0;
  int local_1ac;
  undefined1 local_1a8 [368];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_1a8,0xaa,0x168);
  iVar19 = (*to).x << 2;
  iVar20 = (*to).y << 2;
  local_1c8 = iVar19;
  iStack_1c4 = iVar20;
  iStack_1bc = (*control2).y << 2;
  iStack_1b4 = (*control1).y * 4;
  local_1c0 = (*control2).x << 2;
  iStack_1b8 = (*control1).x << 2;
  iVar11 = (int)worker->x;
  local_1b0 = iVar11;
  iVar13 = (int)worker->y;
  local_1ac = iVar13;
  lVar2 = worker->max_ey;
  iVar9 = iStack_1b4 >> 8;
  iVar7 = iStack_1bc >> 8;
  if (((((iVar20 >> 8 < lVar2) || (iVar7 < lVar2)) || (iVar9 < lVar2)) || (iVar13 >> 8 < lVar2)) &&
     (((lVar2 = worker->min_ey, lVar2 <= iVar20 >> 8 || (lVar2 <= iVar7)) ||
      ((lVar2 <= iVar9 || (lVar2 <= iVar13 >> 8)))))) {
    piVar15 = &local_1c8;
    do {
      uVar6 = (ulong)(iVar11 - iVar19);
      uVar8 = (ulong)(iVar13 - iVar20);
      uVar1 = -uVar6;
      if (0 < (long)uVar6) {
        uVar1 = uVar6;
      }
      uVar10 = -uVar8;
      if (0 < (long)uVar8) {
        uVar10 = uVar8;
      }
      if (uVar10 < uVar1) {
        uVar10 = uVar10 * 3 >> 3;
      }
      else {
        uVar1 = uVar1 * 3 >> 3;
      }
      lVar2 = (long)iVar19;
      lVar5 = (long)iVar20;
      if (uVar10 + uVar1 < 0x800000) {
        uVar17 = (uVar10 + uVar1) * 0x2a;
        iVar9 = piVar15[2];
        iVar7 = piVar15[3];
        lVar3 = (long)(iVar9 - iVar19);
        lVar4 = (long)(iVar7 - iVar20);
        uVar10 = lVar3 * uVar8 - lVar4 * uVar6;
        uVar1 = -uVar10;
        if (0 < (long)uVar10) {
          uVar1 = uVar10;
        }
        if (uVar17 < uVar1) goto LAB_0034e570;
        lVar12 = piVar15[4] - lVar2;
        lVar14 = piVar15[5] - lVar5;
        uVar10 = lVar12 * uVar8 - lVar14 * uVar6;
        uVar1 = -uVar10;
        if (0 < (long)uVar10) {
          uVar1 = uVar10;
        }
        if (((uVar17 < uVar1) ||
            (lVar3 = (lVar3 - uVar6) * lVar3, lVar4 = (lVar4 - uVar8) * lVar4,
            lVar18 = lVar4 + lVar3, lVar18 != 0 && SCARRY8(lVar4,lVar3) == lVar18 < 0)) ||
           (lVar12 = (lVar12 - uVar6) * lVar12, lVar14 = (lVar14 - uVar8) * lVar14,
           lVar3 = lVar14 + lVar12, lVar3 != 0 && SCARRY8(lVar14,lVar12) == lVar3 < 0))
        goto LAB_0034e570;
        gray_render_line(worker,lVar2,lVar5);
        if (piVar15 == &local_1c8) goto LAB_0034e436;
        iVar19 = piVar15[-6];
        piVar16 = piVar15 + -6;
      }
      else {
        iVar9 = piVar15[2];
        iVar7 = piVar15[3];
LAB_0034e570:
        piVar16 = piVar15 + 6;
        piVar15[0xc] = iVar11;
        lVar2 = (lVar2 + iVar9) / 2;
        piVar15[2] = (int)lVar2;
        lVar3 = ((long)iVar11 + (long)piVar15[4]) / 2;
        piVar15[10] = (int)lVar3;
        lVar4 = ((long)piVar15[4] + (long)iVar9) / 2;
        lVar2 = (lVar2 + lVar4) / 2;
        piVar15[4] = (int)lVar2;
        lVar3 = (lVar3 + lVar4) / 2;
        piVar15[8] = (int)lVar3;
        iVar19 = (int)((lVar3 + lVar2) / 2);
        piVar15[6] = iVar19;
        piVar15[0xd] = iVar13;
        lVar2 = (lVar5 + iVar7) / 2;
        piVar15[3] = (int)lVar2;
        lVar5 = ((long)iVar13 + (long)piVar15[5]) / 2;
        piVar15[0xb] = (int)lVar5;
        lVar3 = ((long)piVar15[5] + (long)iVar7) / 2;
        lVar2 = (lVar2 + lVar3) / 2;
        piVar15[5] = (int)lVar2;
        lVar5 = (lVar5 + lVar3) / 2;
        piVar15[9] = (int)lVar5;
        piVar15[7] = (int)((lVar5 + lVar2) / 2);
      }
      iVar11 = piVar16[6];
      iVar13 = piVar16[7];
      iVar20 = piVar16[1];
      piVar15 = piVar16;
    } while( true );
  }
  worker->x = CONCAT44(-(uint)(iVar19 < 0),iVar19);
  (worker->outline).n_contours = iVar20;
  (worker->outline).n_points = -(uint)(iVar20 < 0);
LAB_0034e436:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void
  gray_render_cubic( RAS_ARG_ const QT_FT_Vector*  control1,
                              const QT_FT_Vector*  control2,
                              const QT_FT_Vector*  to )
  {
    QT_FT_Vector   bez_stack[16 * 3 + 1];  /* enough to accommodate bisections */
    QT_FT_Vector*  arc = bez_stack;
    TPos        dx, dy, dx_, dy_;
    TPos        dx1, dy1, dx2, dy2;
    TPos        L, s, s_limit;


    arc[0].x = UPSCALE( to->x );
    arc[0].y = UPSCALE( to->y );
    arc[1].x = UPSCALE( control2->x );
    arc[1].y = UPSCALE( control2->y );
    arc[2].x = UPSCALE( control1->x );
    arc[2].y = UPSCALE( control1->y );
    arc[3].x = ras.x;
    arc[3].y = ras.y;

    /* short-cut the arc that crosses the current band */
    if ( ( TRUNC( arc[0].y ) >= ras.max_ey &&
           TRUNC( arc[1].y ) >= ras.max_ey &&
           TRUNC( arc[2].y ) >= ras.max_ey &&
           TRUNC( arc[3].y ) >= ras.max_ey ) ||
         ( TRUNC( arc[0].y ) <  ras.min_ey &&
           TRUNC( arc[1].y ) <  ras.min_ey &&
           TRUNC( arc[2].y ) <  ras.min_ey &&
           TRUNC( arc[3].y ) <  ras.min_ey ) )
    {
      ras.x = arc[0].x;
      ras.y = arc[0].y;
      return;
    }

    for (;;)
    {
      /* Decide whether to split or draw. See `Rapid Termination          */
      /* Evaluation for Recursive Subdivision of Bezier Curves' by Thomas */
      /* F. Hain, at                                                      */
      /* http://www.cis.southalabama.edu/~hain/general/Publications/Bezier/Camera-ready%20CISST02%202.pdf */


      /* dx and dy are x and y components of the P0-P3 chord vector. */
      dx = dx_ = arc[3].x - arc[0].x;
      dy = dy_ = arc[3].y - arc[0].y;

      L = QT_FT_HYPOT( dx_, dy_ );

      /* Avoid possible arithmetic overflow below by splitting. */
      if ( L >= (1 << 23) )
        goto Split;

      /* Max deviation may be as much as (s/L) * 3/4 (if Hain's v = 1). */
      s_limit = L * (TPos)( ONE_PIXEL / 6 );

      /* s is L * the perpendicular distance from P1 to the line P0-P3. */
      dx1 = arc[1].x - arc[0].x;
      dy1 = arc[1].y - arc[0].y;
      s = QT_FT_ABS( dy * dx1 - dx * dy1 );

      if ( s > s_limit )
        goto Split;

      /* s is L * the perpendicular distance from P2 to the line P0-P3. */
      dx2 = arc[2].x - arc[0].x;
      dy2 = arc[2].y - arc[0].y;
      s = QT_FT_ABS( dy * dx2 - dx * dy2 );

      if ( s > s_limit )
        goto Split;

      /* Split super curvy segments where the off points are so far
         from the chord that the angles P0-P1-P3 or P0-P2-P3 become
         acute as detected by appropriate dot products. */
      if ( dx1 * ( dx1 - dx ) + dy1 * ( dy1 - dy ) > 0 ||
           dx2 * ( dx2 - dx ) + dy2 * ( dy2 - dy ) > 0 )
        goto Split;

      gray_render_line( RAS_VAR_ arc[0].x, arc[0].y );

      if ( arc == bez_stack )
        return;

      arc -= 3;
      continue;

    Split:
      gray_split_cubic( arc );
      arc += 3;
    }
  }